

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O0

laszip_I32 laszip_remove_vlr(laszip_POINTER pointer,laszip_CHAR *user_id,laszip_U16 record_id)

{
  int iVar1;
  void *pvVar2;
  uint local_34;
  U32 i;
  laszip_dll_struct *laszip_dll;
  laszip_U16 record_id_local;
  laszip_CHAR *user_id_local;
  laszip_POINTER pointer_local;
  
  if (pointer != (laszip_POINTER)0x0) {
    if (user_id == (laszip_CHAR *)0x0) {
      snprintf((char *)((long)pointer + 0x248),0x400,"laszip_CHAR pointer \'user_id\' is zero");
    }
    else if (*(long *)((long)pointer + 0x228) == 0) {
      if (*(long *)((long)pointer + 0x238) == 0) {
        if (*(long *)((long)pointer + 0x188) != 0) {
          local_34 = 0;
          while( true ) {
            if (*(uint *)((long)pointer + 0x60) <= local_34) goto LAB_001895cb;
            iVar1 = strncmp((char *)(*(long *)((long)pointer + 0x188) + (ulong)local_34 * 0x40 + 2),
                            user_id,0x10);
            if ((iVar1 == 0) &&
               (*(laszip_U16 *)(*(long *)((long)pointer + 0x188) + (ulong)local_34 * 0x40 + 0x12) ==
                record_id)) break;
            local_34 = local_34 + 1;
          }
          if (*(short *)(*(long *)((long)pointer + 0x188) + (ulong)local_34 * 0x40 + 0x14) != 0) {
            *(uint *)((long)pointer + 0x5c) =
                 *(int *)((long)pointer + 0x5c) -
                 (*(ushort *)(*(long *)((long)pointer + 0x188) + (ulong)local_34 * 0x40 + 0x14) +
                 0x36);
            pvVar2 = *(void **)(*(long *)((long)pointer + 0x188) + (ulong)local_34 * 0x40 + 0x38);
            if (pvVar2 != (void *)0x0) {
              operator_delete__(pvVar2);
            }
            *(undefined8 *)(*(long *)((long)pointer + 0x188) + (ulong)local_34 * 0x40 + 0x38) = 0;
          }
          *(int *)((long)pointer + 0x60) = *(int *)((long)pointer + 0x60) + -1;
          for (; local_34 < *(uint *)((long)pointer + 0x60); local_34 = local_34 + 1) {
            memcpy((void *)(*(long *)((long)pointer + 0x188) + (ulong)local_34 * 0x40),
                   (void *)(*(long *)((long)pointer + 0x188) + (ulong)(local_34 + 1) * 0x40),0x40);
          }
          if (*(int *)((long)pointer + 0x60) == 0) {
            free(*(void **)((long)pointer + 0x188));
            *(undefined8 *)((long)pointer + 0x188) = 0;
          }
          else {
            pvVar2 = realloc_las(*(void **)((long)pointer + 0x188),
                                 (ulong)*(uint *)((long)pointer + 0x60) << 6);
            *(void **)((long)pointer + 0x188) = pvVar2;
            if (*(long *)((long)pointer + 0x188) == 0) {
              snprintf((char *)((long)pointer + 0x248),0x400,"reallocating vlrs[%u] array",
                       (ulong)*(uint *)((long)pointer + 0x60));
              return 1;
            }
          }
          local_34 = 0xffffffff;
LAB_001895cb:
          if (local_34 == 0xffffffff) {
            *(undefined1 *)((long)pointer + 0x248) = 0;
            return 0;
          }
          snprintf((char *)((long)pointer + 0x248),0x400,
                   "cannot find VLR with user_id \'%s\' and record_id %d among the %u VLRs in the header"
                   ,user_id,(ulong)record_id,(ulong)*(uint *)((long)pointer + 0x60));
          return 1;
        }
        snprintf((char *)((long)pointer + 0x248),0x400,
                 "cannot remove VLR with user_id \'%s\' and record_id %d because header has no VLRs"
                 ,user_id,(ulong)record_id);
      }
      else {
        snprintf((char *)((long)pointer + 0x248),0x400,"cannot remove vlr after writer was opened");
      }
    }
    else {
      snprintf((char *)((long)pointer + 0x248),0x400,"cannot remove vlr after reader was opened");
    }
  }
  return 1;
}

Assistant:

LASZIP_API laszip_I32
laszip_remove_vlr(
    laszip_POINTER                     pointer
    , const laszip_CHAR*               user_id
    , laszip_U16                       record_id
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (user_id == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_CHAR pointer 'user_id' is zero");
      return 1;
    }

    if (laszip_dll->reader)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot remove vlr after reader was opened");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot remove vlr after writer was opened");
      return 1;
    }

    U32 i = 0;

    if (laszip_dll->header.vlrs)
    {
      for (i = 0; i < laszip_dll->header.number_of_variable_length_records; i++)
      {
        if ((strncmp(laszip_dll->header.vlrs[i].user_id, user_id, 16) == 0) && (laszip_dll->header.vlrs[i].record_id == record_id))
        {
          if (laszip_dll->header.vlrs[i].record_length_after_header)
          {
            laszip_dll->header.offset_to_point_data -= (54 + laszip_dll->header.vlrs[i].record_length_after_header);
            delete [] laszip_dll->header.vlrs[i].data;
            laszip_dll->header.vlrs[i].data = 0;
          }
          laszip_dll->header.number_of_variable_length_records--;
          for (/*i = i*/; i < laszip_dll->header.number_of_variable_length_records; i++)
          {
            laszip_dll->header.vlrs[i] = laszip_dll->header.vlrs[i+1];
          }
          if (laszip_dll->header.number_of_variable_length_records)
          {
            laszip_dll->header.vlrs = (laszip_vlr_struct*)realloc_las(laszip_dll->header.vlrs, sizeof(laszip_vlr_struct)*laszip_dll->header.number_of_variable_length_records);
            if (laszip_dll->header.vlrs == 0)
            {
              snprintf(laszip_dll->error, sizeof(laszip_dll->error), "reallocating vlrs[%u] array", laszip_dll->header.number_of_variable_length_records);
              return 1;
            }
          }
          else
          {
            free(laszip_dll->header.vlrs);
            laszip_dll->header.vlrs = 0;
          }
          i = U32_MAX;
          break;
        }
      }
      if (i != U32_MAX)
      {
        snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot find VLR with user_id '%s' and record_id %d among the %u VLRs in the header", user_id, (I32)record_id, laszip_dll->header.number_of_variable_length_records);
        return 1;
      }
    }
    else
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot remove VLR with user_id '%s' and record_id %d because header has no VLRs", user_id, (I32)record_id);
      return 1;
    }
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_add_vlr");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}